

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

UriType * __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetUri(UriType *__return_storage_ptr__,
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *root,UriType *rootUri,size_t *unresolvedTokenIndex,CrtAllocator *allocator)

{
  uint uVar1;
  ushort uVar2;
  SizeType SVar3;
  int iVar4;
  Token *pTVar5;
  Token *pTVar6;
  MemberIterator m;
  long local_128;
  GenericStringRef<char> local_118;
  UriType here;
  UriType base;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  if ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
       ::
       GetUri(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>&,rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const&,unsigned_long*,rapidjson::CrtAllocator*)
       ::kIdValue == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                                   ::
                                   GetUri(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>&,rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const&,unsigned_long*,rapidjson::CrtAllocator*)
                                   ::kIdValue), iVar4 != 0)) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(&GetUri::kIdValue,"id",2);
    __cxa_guard_release(&GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                         ::
                         GetUri(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>&,rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const&,unsigned_long*,rapidjson::CrtAllocator*)
                         ::kIdValue);
  }
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::GenericUri(&base,rootUri,allocator);
  if (this->parseErrorCode_ != kPointerParseErrorNone) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x220,
                  "UriType rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::GetUri(ValueType &, const UriType &, size_t *, Allocator *) const [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  pTVar5 = this->tokens_;
  local_128 = -(long)pTVar5;
  pTVar6 = pTVar5;
  do {
    if (pTVar6 == pTVar5 + this->tokenCount_) {
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::GenericUri(__return_storage_ptr__,&base);
LAB_0012286b:
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&base);
      return __return_storage_ptr__;
    }
    uVar2 = (root->data_).f.flags & 7;
    if (uVar2 != 4) {
      if (uVar2 == 3) {
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&m,root);
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&here);
        if ((m.ptr_ != (Pointer)here.uri_) && ((((m.ptr_)->value).data_.f.flags >> 10 & 1) != 0)) {
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
          ::
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                      *)&local_78,&(m.ptr_)->value,allocator);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::Resolve(&here,&local_78,&base,allocator);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&local_78);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::operator=(&base,&here);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&here);
        }
        GenericStringRef<char>::GenericStringRef(&local_118,pTVar6->name,pTVar6->length);
        here.base_ = (Ch *)((ulong)local_118.s | 0x405000000000000);
        here.uri_ = (Ch *)(ulong)local_118.length;
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&local_78,root);
        m.ptr_ = (Pointer)local_78.uri_;
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&here);
        if (m.ptr_ != (Pointer)here.uri_) {
          root = &(m.ptr_)->value;
          goto LAB_001227fb;
        }
      }
LAB_00122811:
      if (unresolvedTokenIndex != (size_t *)0x0) {
        *unresolvedTokenIndex = -((long)&this->tokens_->name + local_128) >> 4;
      }
      __return_storage_ptr__->path_ = (Ch *)0x0;
      __return_storage_ptr__->query_ = (Ch *)0x0;
      __return_storage_ptr__->scheme_ = (Ch *)0x0;
      __return_storage_ptr__->auth_ = (Ch *)0x0;
      __return_storage_ptr__->uri_ = (Ch *)0x0;
      __return_storage_ptr__->base_ = (Ch *)0x0;
      __return_storage_ptr__->frag_ = (Ch *)0x0;
      __return_storage_ptr__->allocator_ = allocator;
      __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
      goto LAB_0012286b;
    }
    uVar1 = pTVar6->index;
    if ((uVar1 == 0xffffffff) ||
       (SVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(root), SVar3 <= uVar1)) goto LAB_00122811;
    root = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator[](root,pTVar6->index);
LAB_001227fb:
    pTVar6 = pTVar6 + 1;
    pTVar5 = this->tokens_;
    local_128 = local_128 + -0x10;
  } while( true );
}

Assistant:

UriType GetUri(ValueType& root, const UriType& rootUri, size_t* unresolvedTokenIndex = 0, Allocator* allocator = 0) const {
        static const Ch kIdString[] = { 'i', 'd', '\0' };
        static const ValueType kIdValue(kIdString, 2);
        UriType base = UriType(rootUri, allocator);
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
                case kObjectType:
                {
                    // See if we have an id, and if so resolve with the current base
                    typename ValueType::MemberIterator m = v->FindMember(kIdValue);
                    if (m != v->MemberEnd() && (m->value).IsString()) {
                        UriType here = UriType(m->value, allocator).Resolve(base, allocator);
                        base = here;
                    }
                    m = v->FindMember(GenericValue<EncodingType>(GenericStringRef<Ch>(t->name, t->length)));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                  continue;
                case kArrayType:
                    if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                        break;
                    v = &((*v)[t->index]);
                    continue;
                default:
                    break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return UriType(allocator);
        }
        return base;
    }